

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O2

char * __thiscall SimpleStringInternalCache::alloc(SimpleStringInternalCache *this,size_t size)

{
  bool bVar1;
  SimpleStringInternalCacheNode *node;
  SimpleStringMemoryBlock *pSVar2;
  
  if (size < 0x101) {
    bVar1 = hasFreeBlocksOfSize(this,size);
    node = getCacheNodeFromSize(this,size);
    if (bVar1) {
      pSVar2 = node->freeMemoryHead_;
      node->freeMemoryHead_ = pSVar2->next_;
      pSVar2->next_ = node->usedMemoryHead_;
      node->usedMemoryHead_ = pSVar2;
    }
    else {
      pSVar2 = allocateNewCacheBlockFrom(this,node);
    }
  }
  else {
    pSVar2 = createSimpleStringMemoryBlock(this,size,this->nonCachedAllocations_);
    this->nonCachedAllocations_ = pSVar2;
  }
  return pSVar2->memory_;
}

Assistant:

char* SimpleStringInternalCache::alloc(size_t size)
{
    if (isCached(size)) {
        if (hasFreeBlocksOfSize(size))
            return reserveCachedBlockFrom(getCacheNodeFromSize(size))->memory_;
        else
            return allocateNewCacheBlockFrom(getCacheNodeFromSize(size))->memory_;
    }

    nonCachedAllocations_ = createSimpleStringMemoryBlock(size, nonCachedAllocations_);
    return nonCachedAllocations_->memory_;
}